

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  bool bVar1;
  int iVar2;
  EnumValueDescriptor *this_00;
  DescriptorStringView psVar3;
  EnumValueDescriptorProto *pEVar4;
  EnumOptions *pEVar5;
  undefined1 auVar6 [16];
  string_view sVar7;
  VoidPtr local_c8;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_c0;
  string_view local_b8;
  undefined1 local_a8 [8];
  anon_class_24_3_0c655f7d make_error;
  undefined1 local_88 [3];
  bool inserted;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  insert_result;
  EnumValueDescriptor *enum_value;
  int local_54;
  undefined1 local_50 [4];
  int i;
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  proto_local = (EnumDescriptorProto *)enm;
  enm_local = (EnumDescriptor *)this;
  CheckEnumValueUniqueness(this,proto,enm);
  bVar1 = EnumDescriptor::is_closed((EnumDescriptor *)proto_local);
  if ((!bVar1) && (iVar2 = EnumDescriptor::value_count((EnumDescriptor *)proto_local), 0 < iVar2)) {
    this_00 = EnumDescriptor::value((EnumDescriptor *)proto_local,0);
    iVar2 = EnumValueDescriptor::number(this_00);
    if (iVar2 != 0) {
      psVar3 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)proto_local);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
      used_values.
      super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)auVar6._0_8_;
      pEVar4 = EnumDescriptorProto::value(proto,0);
      sVar7._M_str = auVar6._8_8_;
      sVar7._M_len = (size_t)used_values.
                             super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             .
                             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             .settings_.
                             super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_.heap.slot_array;
      AddError(this,sVar7,&pEVar4->super_Message,NUMBER,
               "The first enum value must be zero for open enums.");
    }
  }
  pEVar5 = EnumDescriptor::options((EnumDescriptor *)proto_local);
  bVar1 = EnumOptions::has_allow_alias(pEVar5);
  if (bVar1) {
    pEVar5 = EnumDescriptor::options((EnumDescriptor *)proto_local);
    bVar1 = EnumOptions::allow_alias(pEVar5);
    if (bVar1) {
      return;
    }
  }
  absl::lts_20240722::
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_hash_map((flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_50);
  local_54 = 0;
  while( true ) {
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)proto_local);
    if (iVar2 <= local_54) break;
    insert_result._16_8_ = EnumDescriptor::value((EnumDescriptor *)proto_local,local_54);
    make_error.insert_result._4_4_ =
         EnumValueDescriptor::number((EnumValueDescriptor *)insert_result._16_8_);
    psVar3 = EnumValueDescriptor::full_name_abi_cxx11_((EnumValueDescriptor *)insert_result._16_8_);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::
    emplace<int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_88,
               (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_50,(int *)((long)&make_error.insert_result + 4),psVar3);
    make_error.insert_result._3_1_ = insert_result.first.field_1._0_1_ & 1;
    if (make_error.insert_result._3_1_ == 0) {
      pEVar5 = EnumDescriptor::options((EnumDescriptor *)proto_local);
      bVar1 = EnumOptions::allow_alias(pEVar5);
      if (!bVar1) {
        local_a8 = (undefined1  [8])&proto_local;
        make_error.enm = (EnumDescriptor **)&insert_result.second;
        make_error.enum_value = (EnumValueDescriptor **)local_88;
        psVar3 = EnumDescriptor::full_name_abi_cxx11_((EnumDescriptor *)proto_local);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar3);
        local_b8 = sVar7;
        pEVar4 = EnumDescriptorProto::value(proto,local_54);
        absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_c8,
                   (anon_class_24_3_0c655f7d *)local_a8);
        make_error_00.invoker_ = p_Stack_c0;
        make_error_00.ptr_.obj = local_c8.obj;
        AddError(this,local_b8,&pEVar4->super_Message,NUMBER,make_error_00);
      }
    }
    local_54 = local_54 + 1;
  }
  absl::lts_20240722::
  flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~flat_hash_map((flat_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const EnumDescriptor* enm,
                                        const EnumDescriptorProto& proto) {
  CheckEnumValueUniqueness(proto, enm);

  if (!enm->is_closed() && enm->value_count() > 0 &&
      enm->value(0)->number() != 0) {
    AddError(enm->full_name(), proto.value(0),
             DescriptorPool::ErrorCollector::NUMBER,
             "The first enum value must be zero for open enums.");
  }

  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    absl::flat_hash_map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      auto insert_result =
          used_values.emplace(enum_value->number(), enum_value->full_name());
      bool inserted = insert_result.second;
      if (!inserted) {
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          auto make_error = [&] {
            // Find the next free number.
            absl::flat_hash_set<int64_t> used;
            for (int j = 0; j < enm->value_count(); ++j) {
              used.insert(enm->value(j)->number());
            }
            int64_t next_value = static_cast<int64_t>(enum_value->number()) + 1;
            while (used.contains(next_value)) ++next_value;

            std::string error = absl::StrCat(
                "\"", enum_value->full_name(),
                "\" uses the same enum value as \"",
                insert_result.first->second,
                "\". If this is intended, set "
                "'option allow_alias = true;' to the enum definition.");
            if (next_value < std::numeric_limits<int32_t>::max()) {
              absl::StrAppend(&error, " The next available enum value is ",
                              next_value, ".");
            }
            return error;
          };
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
        }
      }
    }
  }
}